

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  uint uVar1;
  FieldDescriptorProto *in_RSI;
  FieldDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_fffffffffffffef8;
  FieldDescriptorProto *in_stack_ffffffffffffff00;
  FieldDescriptorProto *this_00;
  string *in_stack_ffffffffffffff18;
  FieldOptions *in_stack_ffffffffffffff78;
  
  this_00 = (FieldDescriptorProto *)&in_RSI->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_00)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(((InternalMetadataWithArena *)this_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff00 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff00 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  uVar1 = (in_RSI->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((FieldDescriptorProto *)0x4fb711);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 2) != 0) {
      _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x4fb737);
      _internal_set_extendee(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 4) != 0) {
      _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x4fb75d);
      _internal_set_type_name(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 8) != 0) {
      _internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x4fb783);
      _internal_set_default_value(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x10) != 0) {
      _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x4fb7a9);
      _internal_set_json_name(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x20) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff00);
      _internal_options(in_RSI);
      FieldOptions::MergeFrom((FieldOptions *)in_RSI,in_stack_ffffffffffffff78);
    }
    if ((uVar1 & 0x40) != 0) {
      in_RDI->number_ = in_RSI->number_;
    }
    if ((uVar1 & 0x80) != 0) {
      in_RDI->oneof_index_ = in_RSI->oneof_index_;
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      in_RDI->label_ = in_RSI->label_;
    }
    if ((uVar1 & 0x200) != 0) {
      in_RDI->type_ = in_RSI->type_;
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_extendee(from._internal_extendee());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_type_name(from._internal_type_name());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_default_value(from._internal_default_value());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_json_name(from._internal_json_name());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::FieldOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000040u) {
      number_ = from.number_;
    }
    if (cached_has_bits & 0x00000080u) {
      oneof_index_ = from.oneof_index_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      label_ = from.label_;
    }
    if (cached_has_bits & 0x00000200u) {
      type_ = from.type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}